

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

void __thiscall CVmObjIterLookupTable::mark_refs(CVmObjIterLookupTable *this,uint state)

{
  char *buf;
  vm_val_t coll;
  vm_val_t local_20;
  
  buf = (this->super_CVmObjIter).super_CVmObject.ext_;
  local_20.typ = (vm_datatype_t)*buf;
  vmb_get_dh_val(buf,&local_20);
  CVmObjTable::add_to_gc_queue
            (&G_obj_table_X,local_20.val.obj,
             (CVmObjPageEntry *)
             ((long)&G_obj_table_X.pages_[local_20.val.obj >> 0xc]->ptr_ +
             (ulong)((local_20.val.obj & 0xfff) * 0x18)),state);
  return;
}

Assistant:

void CVmObjIterLookupTable::mark_refs(VMG_ uint state)
{
    vm_val_t coll;

    /* my collection is always an object - mark it as referenced */
    get_coll_val(&coll);
    G_obj_table->mark_all_refs(coll.val.obj, state);
}